

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O2

void autocovar(double *vec,int N,double *acov,int M)

{
  ulong uVar1;
  double *pdVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  
  dVar6 = mean(vec,N);
  if (N < M) {
    puts(
        "\n Lag is greater than the length N of the input vector. It is automatically set to length N - 1."
        );
    printf("\n The Output Vector only contains N calculated values.");
    uVar4 = N - 1;
  }
  else {
    uVar4 = 0;
    if (0 < M) {
      uVar4 = M;
    }
  }
  uVar1 = 0;
  pdVar2 = vec;
  uVar5 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar5 = uVar1;
  }
  for (; uVar1 != uVar5; uVar1 = uVar1 + 1) {
    acov[uVar1] = 0.0;
    dVar7 = 0.0;
    for (lVar3 = 0; lVar3 < (long)((long)N - uVar1); lVar3 = lVar3 + 1) {
      dVar7 = dVar7 + (pdVar2[lVar3] - dVar6) * (vec[lVar3] - dVar6);
      acov[uVar1] = dVar7;
    }
    acov[uVar1] = dVar7 / (double)N;
    pdVar2 = pdVar2 + 1;
  }
  return;
}

Assistant:

void autocovar(double* vec,int N, double* acov,int M) {
	double m,temp1,temp2;
	int i,t;
	m = mean(vec,N);
	
	if ( M > N) {
		M = N-1;
		printf("\n Lag is greater than the length N of the input vector. It is automatically set to length N - 1.\n");
		printf("\n The Output Vector only contains N calculated values.");
	} else if ( M < 0) {
		M = 0;
	}
	
	for(i = 0; i < M;i++) {
		acov[i] = 0.0;
		for (t = 0; t < N-i;t++) {
			temp1 = vec[t] - m;
			temp2 = vec[t+i] - m;
			acov[i]+= temp1*temp2;
		}
		acov[i] = acov[i] / N;
		
	}
	
	
}